

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,3,3,0,3,3>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,3,3,0,3,3>>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,_3,_3,_0,_3,_3> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
               *src,assign_op<float,_float> *func)

{
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType local_2a;
  DstEvaluatorType local_28;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_20;
  
  local_20.m_dst = &local_28;
  local_20.m_src = &local_2a;
  local_28.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>.m_d.data =
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>)
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>)dst;
  local_20.m_functor = func;
  local_20.m_dstExpr = dst;
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_9>
  ::run(&local_20);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}